

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAig.c
# Opt level: O1

void Abc_AigAndDelete(Abc_Aig_t *pMan,Abc_Obj_t *pThis)

{
  uint uVar1;
  void **ppvVar2;
  int *piVar3;
  void *pvVar4;
  void *pvVar5;
  ulong uVar6;
  uint uVar7;
  Abc_Obj_t *pAVar8;
  Abc_Obj_t *pAVar9;
  Abc_Obj_t **ppAVar10;
  uint uVar11;
  
  if (((ulong)pThis & 1) != 0) {
    __assert_fail("!Abc_ObjIsComplement(pThis)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcAig.c"
                  ,0x222,"void Abc_AigAndDelete(Abc_Aig_t *, Abc_Obj_t *)");
  }
  uVar1 = *(uint *)&pThis->field_0x14;
  if ((uVar1 & 0xf) != 7) {
    __assert_fail("Abc_ObjIsNode(pThis)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcAig.c"
                  ,0x223,"void Abc_AigAndDelete(Abc_Aig_t *, Abc_Obj_t *)");
  }
  if ((pThis->vFanins).nSize != 2) {
    __assert_fail("Abc_ObjFaninNum(pThis) == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcAig.c"
                  ,0x224,"void Abc_AigAndDelete(Abc_Aig_t *, Abc_Obj_t *)");
  }
  if (pMan->pNtkAig != pThis->pNtk) {
    __assert_fail("pMan->pNtkAig == pThis->pNtk",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcAig.c"
                  ,0x225,"void Abc_AigAndDelete(Abc_Aig_t *, Abc_Obj_t *)");
  }
  ppvVar2 = pThis->pNtk->vObjs->pArray;
  piVar3 = (pThis->vFanins).pArray;
  pvVar4 = ppvVar2[*piVar3];
  pvVar5 = ppvVar2[piVar3[1]];
  uVar11 = 0x38f;
  if (((uVar1 >> 10 ^ (uint)pvVar4) & 1) == 0) {
    uVar11 = 0;
  }
  uVar7 = 0x161;
  if (((uVar1 >> 0xb ^ (uint)pvVar5) & 1) == 0) {
    uVar7 = 0;
  }
  uVar6 = (ulong)(uVar7 ^ uVar11 ^ *(int *)(((ulong)pvVar4 & 0xfffffffffffffffe) + 0x10) * 0x1f01 ^
                 *(int *)(((ulong)pvVar5 & 0xfffffffffffffffe) + 0x10) * 0xb9b) %
          (ulong)(uint)pMan->nBins;
  pAVar9 = pMan->pBins[uVar6];
  if (pAVar9 != (Abc_Obj_t *)0x0) {
    if (pAVar9 == pThis) {
      ppAVar10 = pMan->pBins + uVar6;
    }
    else {
      do {
        pAVar8 = pAVar9;
        pAVar9 = pAVar8->pNext;
        if (pAVar9 == (Abc_Obj_t *)0x0) goto LAB_001b6e86;
      } while (pAVar9 != pThis);
      ppAVar10 = &pAVar8->pNext;
    }
    *ppAVar10 = pAVar9->pNext;
  }
LAB_001b6e86:
  if (pAVar9 != pThis) {
    __assert_fail("pAnd == pThis",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcAig.c"
                  ,0x236,"void Abc_AigAndDelete(Abc_Aig_t *, Abc_Obj_t *)");
  }
  pMan->nEntries = pMan->nEntries + -1;
  pvVar4 = pThis->pNtk->pManCut;
  if (pvVar4 != (void *)0x0) {
    Abc_NodeFreeCuts(pvVar4,pThis);
    return;
  }
  return;
}

Assistant:

void Abc_AigAndDelete( Abc_Aig_t * pMan, Abc_Obj_t * pThis )
{
    Abc_Obj_t * pAnd, * pAnd0, * pAnd1, ** ppPlace;
    unsigned Key;
    assert( !Abc_ObjIsComplement(pThis) );
    assert( Abc_ObjIsNode(pThis) );
    assert( Abc_ObjFaninNum(pThis) == 2 );
    assert( pMan->pNtkAig == pThis->pNtk );
    // get the hash key for these two nodes
    pAnd0 = Abc_ObjRegular( Abc_ObjChild0(pThis) );
    pAnd1 = Abc_ObjRegular( Abc_ObjChild1(pThis) );
    Key = Abc_HashKey2( Abc_ObjChild0(pThis), Abc_ObjChild1(pThis), pMan->nBins );
    // find the matching node in the table
    ppPlace = pMan->pBins + Key;
    Abc_AigBinForEachEntry( pMan->pBins[Key], pAnd )
    {
        if ( pAnd != pThis )
        {
            ppPlace = &pAnd->pNext;
            continue;
        }
        *ppPlace = pAnd->pNext;
        break;
    }
    assert( pAnd == pThis );
    pMan->nEntries--;
    // delete the cuts if defined
    if ( pThis->pNtk->pManCut )
        Abc_NodeFreeCuts( pThis->pNtk->pManCut, pThis );
}